

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O0

void tcu::ImageIO::loadPKM(CompressedTexture *dst,Archive *archive,char *fileName)

{
  deUint16 dVar1;
  deUint16 dVar2;
  int iVar3;
  uint uVar4;
  Resource *pRVar5;
  InternalError *pIVar6;
  char *pcVar7;
  void *pvVar8;
  deUint16 activeHeight;
  deUint16 activeWidth;
  deUint16 height;
  deUint16 width;
  deUint16 type;
  undefined1 local_3e [6];
  deUint8 dStack_38;
  deUint8 dStack_37;
  deUint8 magic [6];
  deUint8 refMagic [6];
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> resource;
  char *fileName_local;
  Archive *archive_local;
  CompressedTexture *dst_local;
  
  iVar3 = (*archive->_vptr_Archive[2])(archive,fileName);
  de::DefaultDeleter<tcu::Resource>::DefaultDeleter((DefaultDeleter<tcu::Resource> *)(magic + 5));
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
            ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic,iVar3);
  builtin_memcpy(magic,"M 10",4);
  dStack_38 = 'P';
  dStack_37 = 'K';
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  (*pRVar5->_vptr_Resource[2])(pRVar5,local_3e,6);
  iVar3 = memcmp(&stack0xffffffffffffffc8,local_3e,6);
  if (iVar3 != 0) {
    pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
    pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                       ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
    Resource::getName_abi_cxx11_(pRVar5);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    InternalError::InternalError
              (pIVar6,"Signature doesn\'t match PKM signature",pcVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0xee);
    __cxa_throw(pIVar6,&InternalError::typeinfo,InternalError::~InternalError);
  }
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::get
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  dVar1 = readBigEndianShort(pRVar5);
  if (dVar1 != 0) {
    pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
    pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                       ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
    Resource::getName_abi_cxx11_(pRVar5);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    InternalError::InternalError
              (pIVar6,"Unsupported PKM type",pcVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0xf2);
    __cxa_throw(pIVar6,&InternalError::typeinfo,InternalError::~InternalError);
  }
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::get
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  readBigEndianShort(pRVar5);
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::get
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  readBigEndianShort(pRVar5);
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::get
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  dVar1 = readBigEndianShort(pRVar5);
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::get
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  dVar2 = readBigEndianShort(pRVar5);
  CompressedTexture::setStorage(dst,COMPRESSEDTEXFORMAT_ETC1_RGB8,(uint)dVar1,(uint)dVar2,1);
  pRVar5 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  pvVar8 = CompressedTexture::getData(dst);
  uVar4 = CompressedTexture::getDataSize(dst);
  (*pRVar5->_vptr_Resource[2])(pRVar5,pvVar8,(ulong)uVar4);
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniquePtr
            ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)refMagic);
  return;
}

Assistant:

void loadPKM (CompressedTexture& dst, const tcu::Archive& archive, const char* fileName)
{
	de::UniquePtr<Resource> resource(archive.getResource(fileName));

	// Check magic and version.
	deUint8 refMagic[] = {'P', 'K', 'M', ' ', '1', '0'};
	deUint8 magic[6];
	resource->read(magic, DE_LENGTH_OF_ARRAY(magic));

	if (memcmp(refMagic, magic, sizeof(magic)) != 0)
		throw InternalError("Signature doesn't match PKM signature", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16 type = readBigEndianShort(resource.get());
	if (type != ETC1_RGB_NO_MIPMAPS)
		throw InternalError("Unsupported PKM type", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16	width			= readBigEndianShort(resource.get());
	deUint16	height			= readBigEndianShort(resource.get());
	deUint16	activeWidth		= readBigEndianShort(resource.get());
	deUint16	activeHeight	= readBigEndianShort(resource.get());

    DE_UNREF(width && height);

	dst.setStorage(COMPRESSEDTEXFORMAT_ETC1_RGB8, (int)activeWidth, (int)activeHeight);
	resource->read((deUint8*)dst.getData(), dst.getDataSize());
}